

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O3

void add_tests_(TestSuite *suite,char *names,...)

{
  anon_union_8_2_f5956e59_for_Runnable aVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  CgreenVector *vector;
  char *pcVar4;
  anon_union_8_2_f5956e59_for_Runnable *paVar5;
  UnitTest *pUVar6;
  uint uVar7;
  undefined8 in_RCX;
  ulong uVar8;
  long lVar9;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list tests;
  anon_union_8_2_f5956e59_for_Runnable *local_f0;
  anon_union_8_2_f5956e59_for_Runnable local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[2] = (anon_union_8_2_f5956e59_for_Runnable)in_RDX;
  local_d8[3] = (anon_union_8_2_f5956e59_for_Runnable)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  vector = create_vector_of_names(names);
  local_f0 = (anon_union_8_2_f5956e59_for_Runnable *)&tests[0].overflow_arg_area;
  uVar7 = 0x10;
  iVar2 = cgreen_vector_size(vector);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      pcVar4 = (char *)cgreen_vector_get(vector,iVar2);
      uVar8 = (ulong)uVar7;
      if (uVar8 < 0x29) {
        uVar7 = uVar7 + 8;
        paVar5 = (anon_union_8_2_f5956e59_for_Runnable *)((long)local_d8 + uVar8);
      }
      else {
        paVar5 = local_f0;
        local_f0 = local_f0 + 1;
      }
      aVar1 = *paVar5;
      iVar3 = suite->size;
      suite->size = iVar3 + 1;
      pUVar6 = (UnitTest *)realloc(suite->tests,((long)iVar3 * 8 + 8) * 3);
      suite->tests = pUVar6;
      lVar9 = (long)suite->size;
      pUVar6[lVar9 + -1].type = 0;
      pUVar6[lVar9 + -1].name = pcVar4;
      pUVar6[lVar9 + -1].Runnable = aVar1;
      iVar2 = iVar2 + 1;
      iVar3 = cgreen_vector_size(vector);
    } while (iVar2 < iVar3);
  }
  destroy_cgreen_vector(vector);
  return;
}

Assistant:

void add_tests_(TestSuite *suite, const char *names, ...) {
    CgreenVector *test_names = create_vector_of_names(names);
    int i;
    va_list tests;
    va_start(tests, names);
    for (i = 0; i < cgreen_vector_size(test_names); i++) {
        add_test_(suite, (char *)(cgreen_vector_get(test_names, i)), va_arg(tests, CgreenTest *));
    }
    va_end(tests);
    destroy_cgreen_vector(test_names);
}